

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void primaryexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  TString *s;
  expdesc key;
  expdesc local_40;
  
  fs = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x11d) {
    singlevar(ls,v);
  }
  else if (iVar1 == 0x28) {
    iVar1 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
  else {
    luaX_syntaxerror(ls,"unexpected symbol");
  }
LAB_001112c4:
  while (iVar1 = (ls->t).token, 0x5a < iVar1) {
    if (iVar1 != 0x5b) {
      if ((iVar1 != 0x7b) && (iVar1 != 0x11e)) {
        return;
      }
      goto LAB_00111336;
    }
    luaK_exp2anyreg(fs,v);
    yindex(ls,&local_40);
    luaK_indexed(fs,v,&local_40);
  }
  if (iVar1 == 0x28) {
LAB_00111336:
    luaK_exp2nextreg(fs,v);
  }
  else {
    if (iVar1 == 0x2e) {
      field(ls,v);
      goto LAB_001112c4;
    }
    if (iVar1 != 0x3a) {
      return;
    }
    luaX_next(ls);
    s = str_checkname(ls);
    local_40.u.s.info = luaK_stringK(ls->fs,s);
    local_40.t = -1;
    local_40.f = -1;
    local_40.k = VK;
    luaK_self(fs,v,&local_40);
  }
  funcargs(ls,v);
  goto LAB_001112c4;
}

Assistant:

static void primaryexp (LexState *ls, expdesc *v) {
  /* primaryexp ->
        prefixexp { `.' NAME | `[' exp `]' | `:' NAME funcargs | funcargs } */
  FuncState *fs = ls->fs;
  prefixexp(ls, v);
  for (;;) {
    switch (ls->t.token) {
      case '.': {  /* field */
        field(ls, v);
        break;
      }
      case '[': {  /* `[' exp1 `]' */
        expdesc key;
        luaK_exp2anyreg(fs, v);
        yindex(ls, &key);
        luaK_indexed(fs, v, &key);
        break;
      }
      case ':': {  /* `:' NAME funcargs */
        expdesc key;
        luaX_next(ls);
        checkname(ls, &key);
        luaK_self(fs, v, &key);
        funcargs(ls, v);
        break;
      }
      case '(': case TK_STRING: case '{': {  /* funcargs */
        luaK_exp2nextreg(fs, v);
        funcargs(ls, v);
        break;
      }
      default: return;
    }
  }
}